

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall OSTEI_VRR_Algorithm_Base::Create(OSTEI_VRR_Algorithm_Base *this,QAM *q)

{
  QAM *in_RDI;
  QuartetSet *in_stack_000000a8;
  OSTEI_VRR_Algorithm_Base *in_stack_000000b0;
  QAM *in_stack_000001d8;
  QAM *in_stack_ffffffffffffff68;
  
  QAM::QAM(in_RDI,in_stack_ffffffffffffff68);
  GenerateQuartetTargets(in_stack_000001d8);
  Create(in_stack_000000b0,in_stack_000000a8);
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x124d1f);
  QAM::~QAM((QAM *)0x124d29);
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create(QAM q)
{
    Create(GenerateQuartetTargets(q));
}